

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

p_ply ply_create(char *name,e_ply_storage_mode storage_mode,p_ply_error_cb error_cb,long idata,
                void *pdata)

{
  FILE *__stream;
  p_ply_error_cb in_RCX;
  code *in_RDX;
  undefined4 in_ESI;
  char *in_RDI;
  long in_R8;
  FILE *fp;
  p_ply ply;
  void *pdata_00;
  undefined4 in_stack_ffffffffffffffe8;
  p_ply local_8;
  
  pdata_00 = (void *)0x0;
  if (in_RDX == (code *)0x0) {
    in_RDX = ply_error_cb;
  }
  __stream = fopen(in_RDI,"wb");
  if (__stream == (FILE *)0x0) {
    (*in_RDX)(pdata_00,"Unable to create file");
    local_8 = (p_ply)0x0;
  }
  else {
    local_8 = ply_create_to_file((FILE *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                 (e_ply_storage_mode)((ulong)in_RDX >> 0x20),in_RCX,in_R8,pdata_00);
    if (local_8 == (p_ply)0x0) {
      fclose(__stream);
    }
    else {
      local_8->own_fp = 1;
    }
  }
  return local_8;
}

Assistant:

p_ply ply_create(const char *name, e_ply_storage_mode storage_mode,
        p_ply_error_cb error_cb, long idata, void *pdata) {
    p_ply ply = NULL;
    FILE *fp = NULL;
    assert(name && storage_mode <= PLY_DEFAULT);
    if (error_cb == NULL) error_cb = ply_error_cb;
    fp = fopen(name, "wb");
    if (!fp) {
        error_cb(ply, "Unable to create file");
        return NULL;
    }
    ply = ply_create_to_file(fp, storage_mode, error_cb, idata, pdata);
    if (ply) ply->own_fp = 1;
    else fclose(fp);
    return ply;
}